

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O2

void __thiscall
SuiteMessageTests::TestorderStatusRequestSetString::TestorderStatusRequestSetString
          (TestorderStatusRequestSetString *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"orderStatusRequestSetString","MessageTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0x422);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031e710;
  return;
}

Assistant:

TEST(orderStatusRequestSetString)
{
  OrderStatusRequest object;

  object.setString
    ( "8=FIX.4.2\0019=30\00135=H\00111=CLIENTID\00154=1\001"
      "55=MSFT\00110=141\001" );

  ClOrdID clOrdID;
  Symbol symbol;
  Side side;
  CHECK_EQUAL( "CLIENTID", object.get( clOrdID ) );
  CHECK_EQUAL( "MSFT", object.get( symbol ) );
  CHECK_EQUAL( '1', object.get( side ) );
}